

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O3

void __thiscall SQTable::_ClearNodes(SQTable *this)

{
  long *plVar1;
  uint uVar2;
  _HashNode *p_Var3;
  long *plVar4;
  long lVar5;
  long lVar6;
  
  if (0 < this->_numofnodes) {
    lVar5 = 0x18;
    lVar6 = 0;
    do {
      p_Var3 = this->_nodes;
      plVar4 = *(long **)((long)&(p_Var3->val).super_SQObject._type + lVar5);
      uVar2 = *(uint *)((long)p_Var3 + lVar5 + -8);
      *(undefined4 *)((long)p_Var3 + lVar5 + -8) = 0x1000001;
      *(undefined8 *)((long)&(p_Var3->val).super_SQObject._type + lVar5) = 0;
      if ((uVar2 >> 0x1b & 1) != 0) {
        plVar1 = plVar4 + 1;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (**(code **)(*plVar4 + 0x10))();
        }
      }
      plVar4 = *(long **)((long)p_Var3 + lVar5 + -0x10);
      uVar2 = *(uint *)((long)p_Var3 + lVar5 + -0x18);
      *(undefined4 *)((long)p_Var3 + lVar5 + -0x18) = 0x1000001;
      *(undefined8 *)((long)p_Var3 + lVar5 + -0x10) = 0;
      if ((uVar2 >> 0x1b & 1) != 0) {
        plVar1 = plVar4 + 1;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (**(code **)(*plVar4 + 0x10))();
        }
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x28;
    } while (lVar6 < this->_numofnodes);
  }
  return;
}

Assistant:

void SQTable::_ClearNodes()
{
    for(SQInteger i = 0;i < _numofnodes; i++) { _HashNode &n = _nodes[i]; n.key.Null(); n.val.Null(); }
}